

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall
xray_re::xr_reader::
r_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,read_point_le>
          (xr_reader *this,size_type n,
          vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *container)

{
  bool bVar1;
  read_point_le local_69;
  way_point_le local_68;
  
  std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::reserve(container,n);
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    local_68.super_way_point.position.field_0._0_8_ = 0;
    local_68.super_way_point._40_8_ = 0;
    local_68.super_way_point.name.field_2._M_allocated_capacity = 0;
    local_68.super_way_point.name.field_2._8_8_ = 0;
    local_68.id = 0;
    local_68._50_6_ = 0;
    local_68.super_way_point.name._M_string_length = 0;
    local_68.super_way_point.name._M_dataplus._M_p = (pointer)&local_68.super_way_point.name.field_2
    ;
    std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::
    emplace_back<xray_re::way_point_le>(container,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    read_point_le::operator()
              (&local_69,
               (container->
               super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>).
               _M_impl.super__Vector_impl_data._M_finish + -1,this);
  }
  return;
}

Assistant:

inline void xr_reader::r_seq(size_t n, T& container, F read)
{
	container.reserve(n);
	while (n--) {
		container.push_back(typename T::value_type());
		read(container.back(), *this);
	}
}